

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

int bucket_realloc_pairs(bucket b,size_t new_capacity)

{
  pair ppVar1;
  
  ppVar1 = (pair)realloc(b->pairs,new_capacity << 4);
  if (ppVar1 == (pair)0x0) {
    log_write_impl_va("metacall",0xb3,"bucket_realloc_pairs",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                      ,3,"Bad pairs reallocation");
  }
  else {
    b->pairs = ppVar1;
    b->capacity = new_capacity;
  }
  return (uint)(ppVar1 == (pair)0x0);
}

Assistant:

int bucket_realloc_pairs(bucket b, size_t new_capacity)
{
	pair pairs = realloc(b->pairs, sizeof(struct pair_type) * new_capacity);

	if (pairs == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad pairs reallocation");
		return 1;
	}

	b->pairs = pairs;
	b->capacity = new_capacity;

	return 0;
}